

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O0

void __thiscall
BindRnase::BindRnase
          (BindRnase *this,double rate_constant,double volume,Rnase *rnase_template,string *name)

{
  string *name_local;
  Rnase *rnase_template_local;
  double volume_local;
  double rate_constant_local;
  BindRnase *this_local;
  
  Bind::Bind(&this->super_Bind,rate_constant,volume,name);
  (this->super_Bind).super_Reaction._vptr_Reaction = (_func_int **)&PTR_CalculatePropensity_002aa968
  ;
  Rnase::Rnase(&this->pol_template_,rnase_template);
  return;
}

Assistant:

BindRnase::BindRnase(double rate_constant, double volume,
                     const Rnase &rnase_template, const std::string &name)
    : Bind(rate_constant, volume, name), pol_template_(rnase_template) {}